

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryExpr::TryExpr(TryExpr *this,Location *loc)

{
  Location *loc_local;
  TryExpr *this_local;
  
  ExprMixin<(wabt::ExprType)46>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)46>,loc);
  (this->super_ExprMixin<(wabt::ExprType)46>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__TryExpr_01e549b0;
  Block::Block(&this->block);
  intrusive_list<wabt::Expr>::intrusive_list(&this->catch_);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc) {}